

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall chrono::fea::ChMatterMeshless::ChMatterMeshless(ChMatterMeshless *this)

{
  undefined1 auVar1 [32];
  __shared_ptr<chrono::fea::ChContinuumPlasticVonMises,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  ChIndexedNodes::ChIndexedNodes(&this->super_ChIndexedNodes);
  (this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChMatterMeshless_01173518;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auVar1 = ZEXT432(0) << 0x40;
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 )auVar1._0_24_;
  (this->material).
  super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar1._24_8_;
  *(undefined1 (*) [32])
   ((long)&(this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = auVar1;
  std::make_shared<chrono::fea::ChContinuumPlasticVonMises>();
  std::__shared_ptr<chrono::fea::ChContinuumElastoplastic,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::fea::ChContinuumElastoplastic,(__gnu_cxx::_Lock_policy)2> *)
             &this->material,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  std::make_shared<chrono::ChMaterialSurfaceNSC>();
  std::__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2> *)&this->matsurface
             ,(__shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

ChMatterMeshless::ChMatterMeshless() : viscosity(0), do_collide(false) {
    // Default: VonMises material
    material = chrono_types::make_shared<ChContinuumPlasticVonMises>();

    // Default: NSC material
    matsurface = chrono_types::make_shared<ChMaterialSurfaceNSC>();
}